

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Execute<duckdb::date_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>>
               (ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *state,date_t x_data,
               string_t y_data,AggregateBinaryInput *binary)

{
  bool bVar1;
  char *pcVar2;
  string_t new_value;
  anon_union_16_2_67f50693_for_value local_28;
  
  pcVar2 = y_data.value._8_8_;
  local_28._0_8_ = y_data.value._0_8_;
  local_28.pointer.ptr = pcVar2;
  bVar1 = string_t::StringComparisonOperators::GreaterThan
                    (&state->value,(string_t *)&local_28.pointer);
  if (bVar1) {
    (state->arg).days = x_data.days;
    new_value.value.pointer.ptr = pcVar2;
    new_value.value._0_8_ = local_28.pointer.ptr;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)&state->value,(string_t *)local_28._0_8_,new_value);
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}